

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV extractObjectInformation
                (CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,CK_OBJECT_CLASS *objClass,
                CK_KEY_TYPE *keyType,CK_CERTIFICATE_TYPE *certType,CK_BBOOL *isOnToken,
                CK_BBOOL *isPrivate,bool bImplicit)

{
  CK_ATTRIBUTE_TYPE CVar1;
  byte bVar2;
  bool bVar3;
  CK_RV CVar4;
  CK_OBJECT_CLASS CVar5;
  bool bVar6;
  unsigned_long *puVar7;
  byte bVar8;
  bool bVar9;
  
  puVar7 = &pTemplate->ulValueLen;
  bVar8 = 0;
  bVar6 = false;
  bVar2 = 0;
  bVar3 = false;
  while (bVar9 = ulCount != 0, ulCount = ulCount - 1, bVar9) {
    CVar1 = ((_CK_ATTRIBUTE *)(puVar7 + -2))->type;
    if (CVar1 == 0x100) {
      if (*puVar7 == 8) {
        *keyType = *(CK_KEY_TYPE *)puVar7[-1];
        bVar6 = true;
      }
    }
    else if (CVar1 == 1) {
      if (*puVar7 == 1) {
        *isOnToken = *(CK_BBOOL *)puVar7[-1];
      }
    }
    else if (CVar1 == 2) {
      if (*puVar7 == 1) {
        *isPrivate = *(CK_BBOOL *)puVar7[-1];
        bVar3 = true;
      }
    }
    else if (CVar1 == 0x80) {
      if (*puVar7 == 8) {
        *certType = *(CK_CERTIFICATE_TYPE *)puVar7[-1];
        bVar2 = 1;
      }
    }
    else if ((CVar1 == 0) && (*puVar7 == 8)) {
      *objClass = *(CK_OBJECT_CLASS *)puVar7[-1];
      bVar8 = 1;
    }
    puVar7 = puVar7 + 3;
  }
  CVar4 = 0xd0;
  if (bImplicit) {
    CVar4 = 0;
  }
  if (((~bVar8 | bImplicit) & 1) == 0) {
    CVar5 = *objClass;
    if (CVar5 - 2 < 3) {
      if (!bVar6) {
        return 0xd0;
      }
    }
    else {
      CVar4 = 0xd0;
      if (CVar5 != 1) {
        CVar4 = 0;
      }
      if (!(bool)(CVar5 == 1 & bVar2)) {
        return CVar4;
      }
      if (bVar3) {
        return 0;
      }
      *isPrivate = '\0';
      CVar5 = *objClass;
    }
    if ((CVar5 == 2) && (!bVar3)) {
      *isPrivate = '\0';
    }
    return 0;
  }
  return CVar4;
}

Assistant:

static CK_RV extractObjectInformation(CK_ATTRIBUTE_PTR pTemplate,
				      CK_ULONG ulCount,
				      CK_OBJECT_CLASS &objClass,
				      CK_KEY_TYPE &keyType,
				      CK_CERTIFICATE_TYPE &certType,
				      CK_BBOOL &isOnToken,
				      CK_BBOOL &isPrivate,
				      bool bImplicit)
{
	bool bHasClass = false;
	bool bHasKeyType = false;
	bool bHasCertType = false;
	bool bHasPrivate = false;

	// Extract object information
	for (CK_ULONG i = 0; i < ulCount; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
				if (pTemplate[i].ulValueLen == sizeof(CK_OBJECT_CLASS))
				{
					objClass = *(CK_OBJECT_CLASS_PTR)pTemplate[i].pValue;
					bHasClass = true;
				}
				break;
			case CKA_KEY_TYPE:
				if (pTemplate[i].ulValueLen == sizeof(CK_KEY_TYPE))
				{
					keyType = *(CK_KEY_TYPE*)pTemplate[i].pValue;
					bHasKeyType = true;
				}
				break;
			case CKA_CERTIFICATE_TYPE:
				if (pTemplate[i].ulValueLen == sizeof(CK_CERTIFICATE_TYPE))
				{
					certType = *(CK_CERTIFICATE_TYPE*)pTemplate[i].pValue;
					bHasCertType = true;
				}
				break;
			case CKA_TOKEN:
				if (pTemplate[i].ulValueLen == sizeof(CK_BBOOL))
				{
					isOnToken = *(CK_BBOOL*)pTemplate[i].pValue;
				}
				break;
			case CKA_PRIVATE:
				if (pTemplate[i].ulValueLen == sizeof(CK_BBOOL))
				{
					isPrivate = *(CK_BBOOL*)pTemplate[i].pValue;
					bHasPrivate = true;
				}
				break;
			default:
				break;
		}
	}

	if (bImplicit)
	{
		return CKR_OK;
	}

	if (!bHasClass)
	{
		return CKR_TEMPLATE_INCOMPLETE;
	}

	bool bKeyTypeRequired = (objClass == CKO_PUBLIC_KEY || objClass == CKO_PRIVATE_KEY || objClass == CKO_SECRET_KEY);
	if (bKeyTypeRequired && !bHasKeyType)
	{
		 return CKR_TEMPLATE_INCOMPLETE;
	}

	if (objClass == CKO_CERTIFICATE)
	{
		if (!bHasCertType)
		{
			return CKR_TEMPLATE_INCOMPLETE;
		}
		if (!bHasPrivate)
		{
			// Change default value for certificates
			isPrivate = CK_FALSE;
		}
	}

	if (objClass == CKO_PUBLIC_KEY && !bHasPrivate)
	{
		// Change default value for public keys
		isPrivate = CK_FALSE;
	}

	return CKR_OK;
}